

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall t_swift_generator::generate_old_enum(t_swift_generator *this,t_enum *tenum)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer pptVar4;
  string local_a8;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string local_70;
  string local_50;
  
  poVar1 = &this->f_decl_;
  t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_a8);
  poVar3 = std::operator<<(poVar3,"public enum ");
  iVar2 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  std::operator<<(poVar3," : Int32");
  std::__cxx11::string::~string((string *)&local_a8);
  block_open(this,(ostream *)poVar1);
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            (&constants,&tenum->constants_);
  for (pptVar4 = constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
    poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_a8);
    poVar3 = std::operator<<(poVar3,"case ");
    poVar3 = std::operator<<(poVar3,(string *)&(*pptVar4)->name_);
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(*pptVar4)->value_);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_a8);
  poVar3 = std::operator<<(poVar3,"public init() { self.init(rawValue: ");
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(*constants.
                               super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>.
                               _M_impl.super__Vector_impl_data._M_start)->value_);
  poVar3 = std::operator<<(poVar3,")! }");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a8);
  block_close(this,(ostream *)poVar1,true);
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
  poVar1 = &this->f_impl_;
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_a8);
  poVar3 = std::operator<<(poVar3,"extension ");
  iVar2 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar2));
  std::operator<<(poVar3," : TEnum");
  std::__cxx11::string::~string((string *)&local_a8);
  block_open(this,(ostream *)poVar1);
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_a8);
  poVar3 = std::operator<<(poVar3,
                           "public static func readValueFromProtocol(proto: TProtocol) throws -> ");
  iVar2 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::operator<<(poVar3,(string *)CONCAT44(extraout_var_01,iVar2));
  std::__cxx11::string::~string((string *)&local_a8);
  block_open(this,(ostream *)poVar1);
  t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_a8);
  poVar3 = std::operator<<(poVar3,"var raw = Int32()");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_50);
  poVar3 = std::operator<<(poVar3,"try proto.readI32(&raw)");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,"return ");
  iVar2 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_02,iVar2));
  poVar3 = std::operator<<(poVar3,"(rawValue: raw)!");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_a8);
  block_close(this,(ostream *)poVar1,true);
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_a8);
  poVar3 = std::operator<<(poVar3,"public static func writeValue(value: ");
  iVar2 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_03,iVar2));
  std::operator<<(poVar3,", toProtocol proto: TProtocol) throws");
  std::__cxx11::string::~string((string *)&local_a8);
  block_open(this,(ostream *)poVar1);
  t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_a8);
  poVar3 = std::operator<<(poVar3,"try proto.writeI32(value.rawValue)");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a8);
  block_close(this,(ostream *)poVar1,true);
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  block_close(this,(ostream *)poVar1,true);
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  std::_Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~_Vector_base
            (&constants.super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>);
  return;
}

Assistant:

void t_swift_generator::generate_old_enum(t_enum* tenum) {
  f_decl_ << indent() << "public enum " << tenum->get_name() << " : Int32";
  block_open(f_decl_);

  vector<t_enum_value*> constants = tenum->get_constants();
  vector<t_enum_value*>::iterator c_iter;

  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    f_decl_ << indent() << "case " << (*c_iter)->get_name()
            << " = " << (*c_iter)->get_value() << endl;
  }

  f_decl_ << endl;
  f_decl_ << indent() << "public init() { self.init(rawValue: " << constants.front()->get_value() << ")! }" << endl;

  block_close(f_decl_);
  f_decl_ << endl;

  f_impl_ << indent() << "extension " << tenum->get_name() << " : TEnum";
  block_open(f_impl_);

  f_impl_ << endl;

  f_impl_ << indent() << "public static func readValueFromProtocol(proto: TProtocol) throws -> " << tenum->get_name();
  block_open(f_impl_);
  f_impl_ << indent() << "var raw = Int32()" << endl
          << indent() << "try proto.readI32(&raw)" << endl
          << indent() << "return " << tenum->get_name() << "(rawValue: raw)!" << endl;
  block_close(f_impl_);
  f_impl_ << endl;

  f_impl_ << indent() << "public static func writeValue(value: " << tenum->get_name() << ", toProtocol proto: TProtocol) throws";
  block_open(f_impl_);
  f_impl_ << indent() << "try proto.writeI32(value.rawValue)" << endl;
  block_close(f_impl_);
  f_impl_ << endl;

  block_close(f_impl_);
  f_impl_ << endl;
}